

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preBegin__image
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  bool bVar1;
  ParserTemplateBase *this_00;
  StringHash attributeHash;
  uint64 uVar2;
  _Elt_pointer pEVar3;
  long *in_RSI;
  ParserChar *in_RDI;
  bool failed_2;
  bool failed_1;
  bool failed;
  ParserChar *attributeValue;
  StringHash hash;
  ParserChar *attribute;
  ParserChar **attributeArray;
  image__AttributeData *attributeData;
  ParserChar *in_stack_00000088;
  ParserChar *in_stack_00000090;
  StringHash in_stack_00000098;
  ErrorType in_stack_000000a0;
  Severity in_stack_000000a4;
  ParserTemplateBase *in_stack_000000a8;
  undefined5 in_stack_ffffffffffffffa8;
  byte in_stack_ffffffffffffffad;
  byte in_stack_ffffffffffffffae;
  byte in_stack_ffffffffffffffaf;
  ParserTemplateBase *in_stack_ffffffffffffffb0;
  SaxParser *additionalText;
  ParserChar *text;
  undefined8 *puVar4;
  bool local_1;
  
  this_00 = (ParserTemplateBase *)
            GeneratedSaxParser::ParserTemplateBase::newData<COLLADASaxFWL14::image__AttributeData>
                      (in_stack_ffffffffffffffb0,
                       (void **)CONCAT17(in_stack_ffffffffffffffaf,
                                         CONCAT16(in_stack_ffffffffffffffae,
                                                  CONCAT15(in_stack_ffffffffffffffad,
                                                           in_stack_ffffffffffffffa8))));
  puVar4 = (undefined8 *)*in_RSI;
  if (puVar4 == (undefined8 *)0x0) {
LAB_008667fb:
    local_1 = true;
  }
  else {
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            text = (ParserChar *)*puVar4;
            if (text == (ParserChar *)0x0) goto LAB_008667fb;
            attributeHash = GeneratedSaxParser::Utils::calculateStringHash(text);
            if (puVar4 + 1 == (undefined8 *)0x0) {
              return false;
            }
            additionalText = (SaxParser *)puVar4[1];
            puVar4 = puVar4 + 2;
            if (attributeHash != 0x6f4) break;
            (this_00->super_Parser).mSaxParser = additionalText;
          }
          if (attributeHash != 0x74835) break;
          (this_00->super_Parser).mErrorHandler = (IErrorHandler *)additionalText;
        }
        if (attributeHash == 0x6ac7a8) break;
        if (attributeHash == 0x7dfba8) {
          pEVar3 = (_Elt_pointer)GeneratedSaxParser::Utils::toUint64(in_RDI,(bool *)0x7dfba8);
          (this_00->mElementDataStack).
          super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur = pEVar3;
          if (((in_stack_ffffffffffffffae & 1) != 0) &&
             (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                                (this_00,(Severity)((ulong)puVar4 >> 0x20),(ErrorType)puVar4,
                                 (StringHash)text,attributeHash,(ParserChar *)additionalText), bVar1
             )) {
            return false;
          }
          if ((in_stack_ffffffffffffffae & 1) == 0) {
            *(uint *)&(this_00->super_Parser)._vptr_Parser =
                 *(uint *)&(this_00->super_Parser)._vptr_Parser | 2;
          }
        }
        else if (attributeHash == 0x6d69384) {
          (this_00->mElementDataStack).
          super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
          ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)additionalText;
        }
        else if (attributeHash == 0x6ebfdf4) {
          uVar2 = GeneratedSaxParser::Utils::toUint64(in_RDI,(bool *)0x6ebfdf4);
          (this_00->mElementDataStack).
          super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
          ._M_impl.super__Deque_impl_data._M_map_size = uVar2;
          if (((in_stack_ffffffffffffffaf & 1) != 0) &&
             (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                                (this_00,(Severity)((ulong)puVar4 >> 0x20),(ErrorType)puVar4,
                                 (StringHash)text,attributeHash,(ParserChar *)additionalText), bVar1
             )) {
            return false;
          }
          if ((in_stack_ffffffffffffffaf & 1) == 0) {
            *(uint *)&(this_00->super_Parser)._vptr_Parser =
                 *(uint *)&(this_00->super_Parser)._vptr_Parser | 1;
          }
        }
        else {
          bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                            (in_stack_000000a8,in_stack_000000a4,in_stack_000000a0,in_stack_00000098
                             ,in_stack_00000090,in_stack_00000088);
          if (bVar1) {
            return false;
          }
        }
      }
      pEVar3 = (_Elt_pointer)
               GeneratedSaxParser::Utils::toUint64(in_RDI,(bool *)(__DT_RELA + 0x12ee9));
      (this_00->mElementDataStack).
      super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
      ._M_impl.super__Deque_impl_data._M_start._M_first = pEVar3;
    } while (((in_stack_ffffffffffffffad & 1) == 0) ||
            (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                               (this_00,(Severity)((ulong)puVar4 >> 0x20),(ErrorType)puVar4,
                                (StringHash)text,attributeHash,(ParserChar *)additionalText), !bVar1
            ));
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__image( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__image( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

image__AttributeData* attributeData = newData<image__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_id:
    {

attributeData->id = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_name:
    {

attributeData->name = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->name, strlen(attributeData->name));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_IMAGE,
            HASH_ATTRIBUTE_name,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    case HASH_ATTRIBUTE_format:
    {

attributeData->format = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_height:
    {
bool failed;
attributeData->height = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_IMAGE,
        HASH_ATTRIBUTE_height,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= image__AttributeData::ATTRIBUTE_HEIGHT_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_width:
    {
bool failed;
attributeData->width = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_IMAGE,
        HASH_ATTRIBUTE_width,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= image__AttributeData::ATTRIBUTE_WIDTH_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_depth:
    {
bool failed;
attributeData->depth = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_IMAGE,
        HASH_ATTRIBUTE_depth,
        attributeValue))
{
    return false;
}

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_IMAGE, attribute, attributeValue))
            {return false;}
    }
    }
    }
}


    return true;
}